

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scale.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeScale(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *pRVar1;
  Arena *pAVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  string *psVar6;
  long lVar7;
  ConvolutionLayerParams *pCVar8;
  unsigned_long uVar9;
  void *pvVar10;
  Rep *pRVar11;
  pointer pcVar12;
  long lVar13;
  uint __val;
  byte bVar14;
  pointer plVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  Type *pTVar19;
  Type *pTVar20;
  LogMessage *pLVar21;
  Type *pTVar22;
  BlobShape *pBVar23;
  undefined8 *puVar24;
  long *plVar25;
  Type *pTVar26;
  ScaleLayerParams *this;
  WeightParams *pWVar27;
  MultiplyLayerParams *pMVar28;
  BiasLayerParams *this_00;
  uint uVar29;
  ulong uVar30;
  RepeatedPtrField<caffe::BlobProto> *this_01;
  uint __len;
  unsigned_long *puVar31;
  ScaleParameter *pSVar32;
  byte bVar33;
  long in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  int *in_stack_00000048;
  vector<long,_std::allocator<long>_> biasShape;
  vector<long,_std::allocator<long>_> scaleShape;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  topMulLayer;
  undefined1 local_488 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478 [2];
  Type *local_450;
  ScaleParameter *local_448;
  int local_440;
  byte local_43a;
  LogFinisher local_439;
  vector<long,_std::allocator<long>_> local_438;
  vector<long,_std::allocator<long>_> local_418;
  RepeatedPtrFieldBase *local_400;
  undefined1 local_3f8 [56];
  Type *local_3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_398;
  undefined1 local_390 [56];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  LogMessage local_340;
  LogMessage local_308;
  LogMessage local_2d0;
  undefined1 local_298 [56];
  LogMessage local_260;
  LogMessage local_228;
  LogMessage local_1f0;
  LogMessage local_1b8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  pTVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  iVar17 = getLayerIndex(pTVar19,in_stack_00000030);
  pTVar20 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(__str_1._M_dataplus._M_p + 0x70),iVar17);
  pSVar32 = pTVar19->scale_param_;
  if (pSVar32 == (ScaleParameter *)0x0) {
    pSVar32 = (ScaleParameter *)&caffe::_ScaleParameter_default_instance_;
  }
  local_398 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)__str_1.field_2._8_8_;
  local_450 = pTVar19;
  if (1 < (pTVar19->bottom_).super_RepeatedPtrFieldBase.current_size_ - 1U) {
    local_488._0_8_ = (Arena *)(local_488 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_488,"Must have 1 or 2 input(s)","");
    errorInCaffeProto((string *)local_488,(local_450->name_).ptr_,(local_450->type_).ptr_);
    if ((Arena *)local_488._0_8_ != (Arena *)(local_488 + 0x10)) {
      operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
    }
  }
  if ((local_450->top_).super_RepeatedPtrFieldBase.current_size_ != 1) {
    local_488._0_8_ = (Arena *)(local_488 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"Must have 1 output","");
    errorInCaffeProto((string *)local_488,(local_450->name_).ptr_,(local_450->type_).ptr_);
    if ((Arena *)local_488._0_8_ != (Arena *)(local_488 + 0x10)) {
      operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
    }
  }
  local_400 = (RepeatedPtrFieldBase *)__str_1._M_string_length;
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((local_450->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_1b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar21 = google::protobuf::internal::LogMessage::operator<<
                        (&local_1b8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
    google::protobuf::internal::LogMessage::~LogMessage(&local_1b8);
  }
  pTVar19 = local_450;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_358,
              (value_type *)((local_450->top_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  local_440 = (pTVar19->bottom_).super_RepeatedPtrFieldBase.current_size_;
  bVar3 = pSVar32->bias_term_;
  bVar33 = local_440 == 1;
  if (((((bool)bVar33) && (bVar3 == false)) || ((local_440 == 2 && (bVar3 != false)))) &&
     ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_488._0_8_ = (Arena *)(local_488 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_488,"There must be 1 weight blob","");
    errorInCaffeProto((string *)local_488,(local_450->name_).ptr_,(local_450->type_).ptr_);
    if ((Arena *)local_488._0_8_ != (Arena *)(local_488 + 0x10)) {
      operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
    }
  }
  if (((bool)bVar33 && bVar3 == true) &&
     ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ != 2)) {
    local_488._0_8_ = (Arena *)(local_488 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_488,"There must be 2 weight blobs","");
    errorInCaffeProto((string *)local_488,(local_450->name_).ptr_,(local_450->type_).ptr_);
    if ((Arena *)local_488._0_8_ != (Arena *)(local_488 + 0x10)) {
      operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
    }
  }
  uVar18 = pSVar32->axis_ + 4;
  local_3c0 = pTVar20;
  if ((uVar18 < 8) && ((0x99U >> (uVar18 & 0x1f) & 1) != 0)) {
    local_488._0_8_ = local_488 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"axis","");
    uVar18 = pSVar32->axis_;
    __val = -uVar18;
    if (0 < (int)uVar18) {
      __val = uVar18;
    }
    __len = 1;
    if (9 < __val) {
      uVar30 = (ulong)__val;
      uVar16 = 4;
      do {
        __len = uVar16;
        uVar29 = (uint)uVar30;
        if (uVar29 < 100) {
          __len = __len - 2;
          goto LAB_003e980f;
        }
        if (uVar29 < 1000) {
          __len = __len - 1;
          goto LAB_003e980f;
        }
        if (uVar29 < 10000) goto LAB_003e980f;
        uVar30 = uVar30 / 10000;
        uVar16 = __len + 4;
      } while (99999 < uVar29);
      __len = __len + 1;
    }
LAB_003e980f:
    psVar5 = (local_450->name_).ptr_;
    psVar6 = (local_450->type_).ptr_;
    local_3f8._0_8_ = local_3f8 + 0x10;
    local_448 = pSVar32;
    local_43a = bVar33;
    std::__cxx11::string::_M_construct((ulong)local_3f8,(char)__len - (char)((int)uVar18 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_3f8._0_8_ + (ulong)(uVar18 >> 0x1f)),__len,__val);
    unsupportedCaffeParrameterWithOption((string *)local_488,psVar5,psVar6,(string *)local_3f8);
    pTVar20 = local_3c0;
    bVar33 = local_43a;
    if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    pSVar32 = local_448;
    if ((Arena *)local_488._0_8_ != (Arena *)(local_488 + 0x10)) {
      operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
    }
  }
  if (pSVar32->axis_ == 1) {
    if (local_440 == 1) {
LAB_003e98f8:
      if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_180,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar21 = google::protobuf::internal::LogMessage::operator<<
                            (&local_180,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
        google::protobuf::internal::LogMessage::~LogMessage(&local_180);
      }
      puVar24 = *(undefined8 **)
                 ((long)((pTVar20->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar24 == (undefined8 *)0x0) {
        puVar24 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar24 + 3) == 2) {
        local_488._0_8_ = (Arena *)(local_488 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_488,"Scale of size 2D when axis = 1 is currently not supported",
                   "");
        errorInCaffeProto((string *)local_488,(local_450->name_).ptr_,(local_450->type_).ptr_);
        if ((Arena *)local_488._0_8_ != (Arena *)(local_488 + 0x10)) {
          operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
        }
      }
    }
  }
  else if ((local_440 == 1) && (pSVar32->axis_ == -3)) goto LAB_003e98f8;
  bVar33 = bVar33 & bVar3;
  bVar14 = bVar3;
  if (pSVar32->axis_ != 1) {
    bVar14 = pSVar32->axis_ == -3 & bVar3;
  }
  if (bVar14 != 0) {
    pTVar22 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        (&(pTVar20->blobs_).super_RepeatedPtrFieldBase,(uint)bVar33);
    pBVar23 = pTVar22->shape_;
    if (pBVar23 == (BlobShape *)0x0) {
      pBVar23 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    if ((pBVar23->dim_).current_size_ == 2) {
      local_488._0_8_ = (Arena *)(local_488 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_488,"Bias of size 2D when axis = 1 is currently not supported","");
      errorInCaffeProto((string *)local_488,(local_450->name_).ptr_,(local_450->type_).ptr_);
      if ((Arena *)local_488._0_8_ != (Arena *)(local_488 + 0x10)) {
        operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
      }
    }
  }
  if (pSVar32->axis_ == 2) {
    if (local_440 == 1) {
LAB_003e9a8a:
      if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_148,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar21 = google::protobuf::internal::LogMessage::operator<<
                            (&local_148,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
        google::protobuf::internal::LogMessage::~LogMessage(&local_148);
      }
      puVar24 = *(undefined8 **)
                 ((long)((pTVar20->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar24 == (undefined8 *)0x0) {
        puVar24 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar24 + 3) == 1) {
        local_488._0_8_ = (Arena *)(local_488 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_488,"Scale of size 1D when axis = 2 is currently not supported",
                   "");
        errorInCaffeProto((string *)local_488,(local_450->name_).ptr_,(local_450->type_).ptr_);
        if ((Arena *)local_488._0_8_ != (Arena *)(local_488 + 0x10)) {
          operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
        }
      }
    }
  }
  else if ((local_440 == 1) && (pSVar32->axis_ == -2)) goto LAB_003e9a8a;
  if (pSVar32->axis_ == 2) {
    if (bVar3 != false) {
LAB_003e9b92:
      pTVar22 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&(pTVar20->blobs_).super_RepeatedPtrFieldBase,(uint)bVar33);
      pBVar23 = pTVar22->shape_;
      if (pBVar23 == (BlobShape *)0x0) {
        pBVar23 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      if ((pBVar23->dim_).current_size_ == 1) {
        local_488._0_8_ = (Arena *)(local_488 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_488,"Bias of size 1D when axis = 2 is currently not supported",""
                  );
        errorInCaffeProto((string *)local_488,(local_450->name_).ptr_,(local_450->type_).ptr_);
        if ((Arena *)local_488._0_8_ != (Arena *)(local_488 + 0x10)) {
          operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
        }
      }
      goto LAB_003e9c08;
    }
    local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_448 = (ScaleParameter *)0x1;
  }
  else {
    if ((bVar3 & pSVar32->axis_ == -2) != 0) goto LAB_003e9b92;
LAB_003e9c08:
    local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_448 = (ScaleParameter *)0x1;
    if (bVar3 != false) {
      this_01 = &pTVar20->blobs_;
      uVar18 = (uint)bVar33;
      pTVar22 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&this_01->super_RepeatedPtrFieldBase,uVar18);
      pBVar23 = pTVar22->shape_;
      if (pBVar23 == (BlobShape *)0x0) {
        pBVar23 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      iVar17 = (pBVar23->dim_).current_size_;
      local_448 = (ScaleParameter *)0x1;
      if (iVar17 != 0) {
        if (iVar17 == 1) {
          pTVar22 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                              (&this_01->super_RepeatedPtrFieldBase,uVar18);
          pBVar23 = pTVar22->shape_;
          if (pBVar23 == (BlobShape *)0x0) {
            pBVar23 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          if ((pBVar23->dim_).current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      (&local_340,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x476);
            pLVar21 = google::protobuf::internal::LogMessage::operator<<
                                (&local_340,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_3f8,pLVar21);
            google::protobuf::internal::LogMessage::~LogMessage(&local_340);
          }
          local_488._0_8_ = ((pBVar23->dim_).rep_)->elements[0];
          if (local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_438,
                       (iterator)
                       local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_488);
          }
          else {
            *local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_488._0_8_;
            local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_448 = (ScaleParameter *)
                      (ulong)(uint)local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                   .super__Vector_impl_data._M_finish[-1];
        }
        else if (iVar17 == 2) {
          pTVar22 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                              (&this_01->super_RepeatedPtrFieldBase,(uint)bVar33);
          pBVar23 = pTVar22->shape_;
          if (pBVar23 == (BlobShape *)0x0) {
            pBVar23 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          if ((pBVar23->dim_).current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      (&local_110,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x476);
            pLVar21 = google::protobuf::internal::LogMessage::operator<<
                                (&local_110,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_3f8,pLVar21);
            google::protobuf::internal::LogMessage::~LogMessage(&local_110);
          }
          local_488._0_8_ = ((pBVar23->dim_).rep_)->elements[0];
          if (local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_438,
                       (iterator)
                       local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_488);
          }
          else {
            *local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_488._0_8_;
            local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_448 = (ScaleParameter *)
                      local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1];
          pTVar22 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                              (&this_01->super_RepeatedPtrFieldBase,(uint)bVar33);
          pBVar23 = pTVar22->shape_;
          if (pBVar23 == (BlobShape *)0x0) {
            pBVar23 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          if ((pBVar23->dim_).current_size_ < 2) {
            google::protobuf::internal::LogMessage::LogMessage
                      (&local_340,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x476);
            pLVar21 = google::protobuf::internal::LogMessage::operator<<
                                (&local_340,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_3f8,pLVar21);
            google::protobuf::internal::LogMessage::~LogMessage(&local_340);
          }
          local_488._0_8_ = (pBVar23->dim_).rep_[1].arena;
          if (local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_438,
                       (iterator)
                       local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_488);
          }
          else {
            *local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_488._0_8_;
            local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_448 = (ScaleParameter *)
                      (ulong)(uint)((int)local_448 *
                                   (int)local_438.super__Vector_base<long,_std::allocator<long>_>.
                                        _M_impl.super__Vector_impl_data._M_finish[-1]);
        }
        else if (iVar17 - 3U < 2) {
          pTVar22 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                              (&this_01->super_RepeatedPtrFieldBase,uVar18);
          pBVar23 = pTVar22->shape_;
          if (pBVar23 == (BlobShape *)0x0) {
            pBVar23 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          plVar25 = google::protobuf::RepeatedField<long>::Get(&pBVar23->dim_,iVar17 - 3U);
          local_488._0_8_ = *plVar25;
          if (local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_438,
                       (iterator)
                       local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_488);
          }
          else {
            *local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_488._0_8_;
            local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_448 = (ScaleParameter *)
                      local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1];
          pTVar22 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                              (&this_01->super_RepeatedPtrFieldBase,uVar18);
          pBVar23 = pTVar22->shape_;
          if (pBVar23 == (BlobShape *)0x0) {
            pBVar23 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          plVar25 = google::protobuf::RepeatedField<long>::Get(&pBVar23->dim_,iVar17 + -2);
          local_488._0_8_ = *plVar25;
          if (local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_438,
                       (iterator)
                       local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_488);
          }
          else {
            *local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_488._0_8_;
            local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_448 = (ScaleParameter *)
                      ((long)local_448 *
                      local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1]);
          pTVar22 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                              (&this_01->super_RepeatedPtrFieldBase,(uint)bVar33);
          pBVar23 = pTVar22->shape_;
          if (pBVar23 == (BlobShape *)0x0) {
            pBVar23 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          plVar25 = google::protobuf::RepeatedField<long>::Get(&pBVar23->dim_,iVar17 + -1);
          local_488._0_8_ = *plVar25;
          if (local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_438,
                       (iterator)
                       local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_488);
          }
          else {
            *local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_488._0_8_;
            local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_448 = (ScaleParameter *)
                      (ulong)(uint)((int)local_448 *
                                   (int)local_438.super__Vector_base<long,_std::allocator<long>_>.
                                        _M_impl.super__Vector_impl_data._M_finish[-1]);
          if (iVar17 == 4) {
            pTVar22 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                (&this_01->super_RepeatedPtrFieldBase,(uint)bVar33);
            pBVar23 = pTVar22->shape_;
            if (pBVar23 == (BlobShape *)0x0) {
              pBVar23 = (BlobShape *)&caffe::_BlobShape_default_instance_;
            }
            if ((pBVar23->dim_).current_size_ < 1) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_340,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x476);
              pLVar21 = google::protobuf::internal::LogMessage::operator<<
                                  (&local_340,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
              google::protobuf::internal::LogMessage::~LogMessage(&local_340);
            }
            if (((pBVar23->dim_).rep_)->elements[0] != 1) {
              local_488._0_8_ = local_488 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"bias","");
              psVar5 = (local_450->name_).ptr_;
              psVar6 = (local_450->type_).ptr_;
              local_3f8._0_8_ = local_3f8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3f8,"4D bias only supported when 1st dimension is 1","");
              unsupportedCaffeParrameterWithOption
                        ((string *)local_488,psVar5,psVar6,(string *)local_3f8);
              goto LAB_003e9e8c;
            }
          }
        }
        else {
          local_488._0_8_ = local_488 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"bias","");
          psVar5 = (local_450->name_).ptr_;
          psVar6 = (local_450->type_).ptr_;
          local_3f8._0_8_ = local_3f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3f8,">4D bias not supported","");
          unsupportedCaffeParrameterWithOption
                    ((string *)local_488,psVar5,psVar6,(string *)local_3f8);
LAB_003e9e8c:
          if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
            operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
          }
          if ((Arena *)local_488._0_8_ != (Arena *)(local_488 + 0x10)) {
            operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
          }
        }
      }
      pTVar22 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&this_01->super_RepeatedPtrFieldBase,(uint)bVar33);
      if ((pTVar22->data_).current_size_ != (int)local_448) {
        local_488._0_8_ = (Arena *)(local_488 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_488,"Bias blob data inconsistent with the blob dimensions","");
        errorInCaffeProto((string *)local_488,(local_450->name_).ptr_,(local_450->type_).ptr_);
        if ((Arena *)local_488._0_8_ != (Arena *)(local_488 + 0x10)) {
          operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
        }
      }
    }
  }
  local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (long *)0x0;
  iVar17 = 1;
  if (local_440 != 1) goto LAB_003ea682;
  if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar21 = google::protobuf::internal::LogMessage::operator<<
                        (&local_d8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
  }
  puVar24 = *(undefined8 **)
             ((long)((pTVar20->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
  if (puVar24 == (undefined8 *)0x0) {
    puVar24 = &caffe::_BlobShape_default_instance_;
  }
  iVar4 = *(int *)(puVar24 + 3);
  iVar17 = 1;
  if (iVar4 != 0) {
    if (iVar4 == 1) {
      if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_308,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar21 = google::protobuf::internal::LogMessage::operator<<
                            (&local_308,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_3f8,pLVar21);
        google::protobuf::internal::LogMessage::~LogMessage(&local_308);
      }
      puVar24 = *(undefined8 **)
                 ((long)((pTVar20->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar24 == (undefined8 *)0x0) {
        puVar24 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar24 + 3) < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_2d0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar21 = google::protobuf::internal::LogMessage::operator<<
                            (&local_2d0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_3f8,pLVar21);
        google::protobuf::internal::LogMessage::~LogMessage(&local_2d0);
      }
      local_488._0_8_ = *(long *)(puVar24[4] + 8);
      if (local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_418,
                   (iterator)
                   local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_488);
      }
      else {
        *local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_488._0_8_;
        local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar17 = (int)local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1];
    }
    else if (iVar4 == 2) {
      if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_228,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar21 = google::protobuf::internal::LogMessage::operator<<
                            (&local_228,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_3f8,pLVar21);
        google::protobuf::internal::LogMessage::~LogMessage(&local_228);
      }
      puVar24 = *(undefined8 **)
                 ((long)((pTVar20->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar24 == (undefined8 *)0x0) {
        puVar24 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar24 + 3) < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar21 = google::protobuf::internal::LogMessage::operator<<
                            (&local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_3f8,pLVar21);
        google::protobuf::internal::LogMessage::~LogMessage(&local_1f0);
      }
      local_488._0_8_ = *(long *)(puVar24[4] + 8);
      if (local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_418,
                   (iterator)
                   local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_488);
      }
      else {
        *local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_488._0_8_;
        local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar7 = local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_308,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar21 = google::protobuf::internal::LogMessage::operator<<
                            (&local_308,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_3f8,pLVar21);
        google::protobuf::internal::LogMessage::~LogMessage(&local_308);
      }
      puVar24 = *(undefined8 **)
                 ((long)((pTVar20->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar24 == (undefined8 *)0x0) {
        puVar24 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar24 + 3) < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_2d0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar21 = google::protobuf::internal::LogMessage::operator<<
                            (&local_2d0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_3f8,pLVar21);
        google::protobuf::internal::LogMessage::~LogMessage(&local_2d0);
      }
      local_488._0_8_ = *(long *)(puVar24[4] + 0x10);
      if (local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_418,
                   (iterator)
                   local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_488);
      }
      else {
        *local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_488._0_8_;
        local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar17 = (int)lVar7 *
               (int)local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1];
    }
    else if (iVar4 - 3U < 2) {
      if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar21 = google::protobuf::internal::LogMessage::operator<<
                            (&local_a0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_3f8,pLVar21);
        google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
      }
      puVar24 = *(undefined8 **)
                 ((long)((pTVar20->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar24 == (undefined8 *)0x0) {
        puVar24 = &caffe::_BlobShape_default_instance_;
      }
      plVar25 = google::protobuf::RepeatedField<long>::Get
                          ((RepeatedField<long> *)(puVar24 + 3),iVar4 - 3U);
      local_488._0_8_ = *plVar25;
      if (local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_418,
                   (iterator)
                   local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_488);
      }
      else {
        *local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_488._0_8_;
        local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar7 = local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_228,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar21 = google::protobuf::internal::LogMessage::operator<<
                            (&local_228,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_3f8,pLVar21);
        google::protobuf::internal::LogMessage::~LogMessage(&local_228);
      }
      puVar24 = *(undefined8 **)
                 ((long)((pTVar20->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar24 == (undefined8 *)0x0) {
        puVar24 = &caffe::_BlobShape_default_instance_;
      }
      plVar25 = google::protobuf::RepeatedField<long>::Get
                          ((RepeatedField<long> *)(puVar24 + 3),iVar4 + -2);
      local_488._0_8_ = *plVar25;
      if (local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_418,
                   (iterator)
                   local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_488);
      }
      else {
        *local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_488._0_8_;
        local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar13 = local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
      if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar21 = google::protobuf::internal::LogMessage::operator<<
                            (&local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_3f8,pLVar21);
        google::protobuf::internal::LogMessage::~LogMessage(&local_1f0);
      }
      puVar24 = *(undefined8 **)
                 ((long)((pTVar20->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar24 == (undefined8 *)0x0) {
        puVar24 = &caffe::_BlobShape_default_instance_;
      }
      plVar25 = google::protobuf::RepeatedField<long>::Get
                          ((RepeatedField<long> *)(puVar24 + 3),iVar4 + -1);
      local_488._0_8_ = *plVar25;
      if (local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_418,
                   (iterator)
                   local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_488);
      }
      else {
        *local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_488._0_8_;
        local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar17 = (int)lVar7 * (int)lVar13 *
               (int)local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1];
      if (iVar4 == 4) {
        if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_308,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar21 = google::protobuf::internal::LogMessage::operator<<
                              (&local_308,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
          google::protobuf::internal::LogMessage::~LogMessage(&local_308);
        }
        puVar24 = *(undefined8 **)
                   ((long)((pTVar20->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
        if (puVar24 == (undefined8 *)0x0) {
          puVar24 = &caffe::_BlobShape_default_instance_;
        }
        if (*(int *)(puVar24 + 3) < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_2d0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x476);
          pLVar21 = google::protobuf::internal::LogMessage::operator<<
                              (&local_2d0,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
          google::protobuf::internal::LogMessage::~LogMessage(&local_2d0);
        }
        if (*(long *)(puVar24[4] + 8) != 1) {
          local_488._0_8_ = local_488 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"scale","");
          psVar5 = (local_450->name_).ptr_;
          psVar6 = (local_450->type_).ptr_;
          local_3f8._0_8_ = local_3f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3f8,"4D scale only supported when 1st dimension is 1","");
          unsupportedCaffeParrameterWithOption
                    ((string *)local_488,psVar5,psVar6,(string *)local_3f8);
          goto LAB_003ea42b;
        }
      }
    }
    else {
      local_488._0_8_ = local_488 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"scale","");
      psVar5 = (local_450->name_).ptr_;
      psVar6 = (local_450->type_).ptr_;
      local_3f8._0_8_ = local_3f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3f8,">4D scale not supported","");
      unsupportedCaffeParrameterWithOption((string *)local_488,psVar5,psVar6,(string *)local_3f8);
LAB_003ea42b:
      if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
        operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
      }
      if ((Arena *)local_488._0_8_ != (Arena *)(local_488 + 0x10)) {
        operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
      }
    }
  }
  if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar21 = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  if (*(int *)((long)((pTVar20->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18) !=
      iVar17) {
    local_488._0_8_ = (Arena *)(local_488 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_488,"Scale blob data size inconsistent with the  blob dimensions","")
    ;
    errorInCaffeProto((string *)local_488,(local_450->name_).ptr_,(local_450->type_).ptr_);
    if ((Arena *)local_488._0_8_ != (Arena *)(local_488 + 0x10)) {
      operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
    }
  }
LAB_003ea682:
  pTVar20 = local_450;
  if (local_440 == 1) {
    pTVar26 = google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                        (local_400,(Type *)0x0);
    pTVar20 = local_450;
    if ((local_450->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_390,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar21 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_390,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_390);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_3b8,
                (value_type *)((pTVar20->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
    convertCaffeMetadata
              ((pTVar20->name_).ptr_,&local_3b8,&local_358,
               (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_400,local_398);
    if (pTVar26->_oneof_case_[0] != 0xf5) {
      CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar26);
      pTVar26->_oneof_case_[0] = 0xf5;
      this = (ScaleLayerParams *)operator_new(0x58);
      CoreML::Specification::ScaleLayerParams::ScaleLayerParams(this);
      (pTVar26->layer_).scale_ = this;
    }
    plVar15 = local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pCVar8 = (pTVar26->layer_).convolution_;
    if (local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      puVar31 = (unsigned_long *)
                local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        uVar9 = *puVar31;
        if ((long)uVar9 < 0) {
          __assert_fail("dim >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Scale.cpp"
                        ,0xd4,
                        "void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters)"
                       );
        }
        iVar4 = (pCVar8->kernelsize_).total_size_;
        if ((pCVar8->kernelsize_).current_size_ == iVar4) {
          google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar8->kernelsize_,iVar4 + 1);
        }
        iVar4 = (pCVar8->kernelsize_).current_size_;
        (pCVar8->kernelsize_).current_size_ = iVar4 + 1;
        ((pCVar8->kernelsize_).rep_)->elements[iVar4] = uVar9;
        puVar31 = puVar31 + 1;
      } while (puVar31 != (unsigned_long *)plVar15);
    }
    pTVar20 = local_3c0;
    lVar13._0_4_ = (pCVar8->dilationfactor_).current_size_;
    lVar13._4_4_ = (pCVar8->dilationfactor_).total_size_;
    if (lVar13 == 0) {
      pWVar27 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar27);
      *(WeightParams **)&pCVar8->dilationfactor_ = pWVar27;
    }
    lVar7 = *(long *)&pCVar8->dilationfactor_;
    if (iVar17 < 0) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_298,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x46a);
      pLVar21 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_298,"CHECK failed: (new_size) >= (0): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_298);
    }
    pRVar1 = (RepeatedField<float> *)(lVar7 + 0x10);
    if (pRVar1->current_size_ < iVar17) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar17);
      iVar4 = pRVar1->current_size_;
      if (iVar4 != iVar17) {
        memset((void *)(*(long *)(lVar7 + 0x18) + (long)iVar4 * 4 + 8),0,
               (long)iVar17 * 4 + (long)iVar4 * -4);
      }
    }
    pRVar1->current_size_ = iVar17;
    if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_3f8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar21 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_3f8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_3f8);
    }
    pvVar10 = ((pTVar20->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0];
    if ((RepeatedField<float> *)((long)pvVar10 + 0x18) != pRVar1) {
      pRVar1->current_size_ = 0;
      iVar17 = ((RepeatedField<float> *)((long)pvVar10 + 0x18))->current_size_;
      if (iVar17 != 0) {
        google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar17);
        memcpy((void *)(*(long *)(lVar7 + 0x18) + (long)*(int *)(lVar7 + 0x10) * 4 + 8),
               (void *)(*(long *)((long)pvVar10 + 0x20) + 8),
               (long)*(int *)((long)pvVar10 + 0x18) << 2);
        *(int *)(lVar7 + 0x10) = *(int *)(lVar7 + 0x10) + *(int *)((long)pvVar10 + 0x18);
      }
    }
    plVar15 = local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (bVar3 != false) {
      *(undefined1 *)&pCVar8->_dilationfactor_cached_byte_size_ = 1;
      if (local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        puVar31 = (unsigned_long *)
                  local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          uVar9 = *puVar31;
          if ((long)uVar9 < 0) {
            __assert_fail("dim >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Scale.cpp"
                          ,0xdd,
                          "void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters)"
                         );
          }
          iVar17 = (pCVar8->stride_).total_size_;
          if ((pCVar8->stride_).current_size_ == iVar17) {
            google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar8->stride_,iVar17 + 1);
          }
          iVar17 = (pCVar8->stride_).current_size_;
          (pCVar8->stride_).current_size_ = iVar17 + 1;
          ((pCVar8->stride_).rep_)->elements[iVar17] = uVar9;
          puVar31 = puVar31 + 1;
        } while (puVar31 != (unsigned_long *)plVar15);
      }
      pTVar20 = local_3c0;
      pSVar32 = local_448;
      if ((pCVar8->dilationfactor_).rep_ == (Rep *)0x0) {
        pWVar27 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar27);
        (pCVar8->dilationfactor_).rep_ = (Rep *)pWVar27;
      }
      pRVar11 = (pCVar8->dilationfactor_).rep_;
      iVar17 = (int)pSVar32;
      if (iVar17 < 0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_260,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x46a);
        pLVar21 = google::protobuf::internal::LogMessage::operator<<
                            (&local_260,"CHECK failed: (new_size) >= (0): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
        google::protobuf::internal::LogMessage::~LogMessage(&local_260);
      }
      pRVar1 = (RepeatedField<float> *)(pRVar11 + 1);
      if (pRVar1->current_size_ < iVar17) {
        google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar17);
        iVar4 = pRVar1->current_size_;
        if (iVar4 != iVar17) {
          memset((void *)(pRVar11[1].elements[0] + (long)iVar4 * 4 + 8),0,
                 (long)iVar17 * 4 + (long)iVar4 * -4);
        }
      }
      pRVar1->current_size_ = iVar17;
      if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_488,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar21 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_488,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_439,pLVar21);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_488);
      }
      lVar7 = *(long *)((pTVar20->blobs_).super_RepeatedPtrFieldBase.rep_ + 1);
      if ((RepeatedField<float> *)(lVar7 + 0x18) != pRVar1) {
        pRVar1->current_size_ = 0;
        iVar17 = ((RepeatedField<float> *)(lVar7 + 0x18))->current_size_;
        if (iVar17 != 0) {
          google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar17);
          memcpy((void *)(pRVar11[1].elements[0] + (long)*(int *)&pRVar11[1].arena * 4 + 8),
                 (void *)(*(long *)(lVar7 + 0x20) + 8),(long)*(int *)(lVar7 + 0x18) << 2);
          *(int *)&pRVar11[1].arena = *(int *)&pRVar11[1].arena + *(int *)(lVar7 + 0x18);
        }
      }
    }
  }
  else if (bVar3 == false) {
    pTVar26 = google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                        (local_400,(Type *)0x0);
    if ((pTVar20->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_3f8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar21 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_3f8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_3f8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_3b8,
                (value_type *)((pTVar20->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
    if ((pTVar20->bottom_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_488,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar21 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_488,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_390,pLVar21);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_488);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_3b8,*(value_type **)((pTVar20->bottom_).super_RepeatedPtrFieldBase.rep_ + 1))
    ;
    psVar5 = (pTVar20->name_).ptr_;
    pcVar12 = (psVar5->_M_dataplus)._M_p;
    local_390._0_8_ = local_390 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_390,pcVar12,pcVar12 + psVar5->_M_string_length);
    std::__cxx11::string::append(local_390);
    convertCaffeMetadata
              ((string *)local_390,&local_3b8,&local_358,
               (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_400,local_398);
    if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
      operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
    }
    if (pTVar26->_oneof_case_[0] != 0xe7) {
      CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar26);
      pTVar26->_oneof_case_[0] = 0xe7;
      pMVar28 = (MultiplyLayerParams *)operator_new(0x18);
      CoreML::Specification::MultiplyLayerParams::MultiplyLayerParams(pMVar28);
      (pTVar26->layer_).multiply_ = pMVar28;
    }
  }
  else {
    pTVar26 = google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                        (local_400,(Type *)0x0);
    if ((pTVar20->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_390,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar21 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_390,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_390);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_3b8,
                (value_type *)((pTVar20->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
    if ((pTVar20->bottom_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_3f8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar21 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_3f8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_3f8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_3b8,*(value_type **)((pTVar20->bottom_).super_RepeatedPtrFieldBase.rep_ + 1))
    ;
    local_298._0_8_ = (pointer)0x0;
    local_298._8_8_ = (pointer)0x0;
    local_298._16_8_ = (pointer)0x0;
    psVar5 = (pTVar20->name_).ptr_;
    pAVar2 = (Arena *)(local_488 + 0x10);
    pcVar12 = (psVar5->_M_dataplus)._M_p;
    local_488._0_8_ = pAVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_488,pcVar12,pcVar12 + psVar5->_M_string_length);
    std::__cxx11::string::append(local_488);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_298,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488);
    if ((Arena *)local_488._0_8_ != pAVar2) {
      operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
    }
    psVar5 = (pTVar20->name_).ptr_;
    pcVar12 = (psVar5->_M_dataplus)._M_p;
    local_488._0_8_ = pAVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_488,pcVar12,pcVar12 + psVar5->_M_string_length);
    std::__cxx11::string::append(local_488);
    convertCaffeMetadata
              ((string *)local_488,&local_3b8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_298,(RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_400
               ,local_398);
    if ((Arena *)local_488._0_8_ != pAVar2) {
      operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
    }
    if (pTVar26->_oneof_case_[0] != 0xe7) {
      CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar26);
      pTVar26->_oneof_case_[0] = 0xe7;
      pMVar28 = (MultiplyLayerParams *)operator_new(0x18);
      CoreML::Specification::MultiplyLayerParams::MultiplyLayerParams(pMVar28);
      (pTVar26->layer_).multiply_ = pMVar28;
    }
    pTVar26 = google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                        (local_400,(Type *)0x0);
    psVar5 = (pTVar20->name_).ptr_;
    pcVar12 = (psVar5->_M_dataplus)._M_p;
    local_488._0_8_ = pAVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_488,pcVar12,pcVar12 + psVar5->_M_string_length);
    std::__cxx11::string::append(local_488);
    convertCaffeMetadata
              ((string *)local_488,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_298,&local_358,
               (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_400,local_398);
    if ((Arena *)local_488._0_8_ != pAVar2) {
      operator_delete((void *)local_488._0_8_,local_478[0]._M_allocated_capacity + 1);
    }
    if (pTVar26->_oneof_case_[0] != 0xfa) {
      CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar26);
      pTVar26->_oneof_case_[0] = 0xfa;
      this_00 = (BiasLayerParams *)operator_new(0x38);
      CoreML::Specification::BiasLayerParams::BiasLayerParams(this_00);
      (pTVar26->layer_).bias_ = this_00;
    }
    plVar15 = local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pCVar8 = (pTVar26->layer_).convolution_;
    if (local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      puVar31 = (unsigned_long *)
                local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        uVar9 = *puVar31;
        if ((long)uVar9 < 0) {
          __assert_fail("dim >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Scale.cpp"
                        ,0xf6,
                        "void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters)"
                       );
        }
        iVar17 = (pCVar8->kernelsize_).total_size_;
        if ((pCVar8->kernelsize_).current_size_ == iVar17) {
          google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar8->kernelsize_,iVar17 + 1);
        }
        iVar17 = (pCVar8->kernelsize_).current_size_;
        (pCVar8->kernelsize_).current_size_ = iVar17 + 1;
        ((pCVar8->kernelsize_).rep_)->elements[iVar17] = uVar9;
        puVar31 = puVar31 + 1;
      } while (puVar31 != (unsigned_long *)plVar15);
    }
    pTVar20 = local_3c0;
    pSVar32 = local_448;
    lVar7._0_4_ = (pCVar8->stride_).current_size_;
    lVar7._4_4_ = (pCVar8->stride_).total_size_;
    if (lVar7 == 0) {
      pWVar27 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar27);
      *(WeightParams **)&pCVar8->stride_ = pWVar27;
    }
    lVar7 = *(long *)&pCVar8->stride_;
    iVar17 = (int)pSVar32;
    if (iVar17 < 0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_260,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x46a);
      pLVar21 = google::protobuf::internal::LogMessage::operator<<
                          (&local_260,"CHECK failed: (new_size) >= (0): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_488,pLVar21);
      google::protobuf::internal::LogMessage::~LogMessage(&local_260);
    }
    pRVar1 = (RepeatedField<float> *)(lVar7 + 0x10);
    if (pRVar1->current_size_ < iVar17) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar17);
      iVar4 = pRVar1->current_size_;
      if (iVar4 != iVar17) {
        memset((void *)(*(long *)(lVar7 + 0x18) + (long)iVar4 * 4 + 8),0,
               (long)iVar17 * 4 + (long)iVar4 * -4);
      }
    }
    pRVar1->current_size_ = iVar17;
    if ((pTVar20->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_488,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar21 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_488,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_439,pLVar21);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_488);
    }
    pvVar10 = ((pTVar20->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0];
    if ((RepeatedField<float> *)((long)pvVar10 + 0x18) != pRVar1) {
      pRVar1->current_size_ = 0;
      iVar17 = ((RepeatedField<float> *)((long)pvVar10 + 0x18))->current_size_;
      if (iVar17 != 0) {
        google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar17);
        memcpy((void *)(*(long *)(lVar7 + 0x18) + (long)*(int *)(lVar7 + 0x10) * 4 + 8),
               (void *)(*(long *)((long)pvVar10 + 0x20) + 8),
               (long)*(int *)((long)pvVar10 + 0x18) << 2);
        *(int *)(lVar7 + 0x10) = *(int *)(lVar7 + 0x10) + *(int *)((long)pvVar10 + 0x18);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_298);
  }
  if ((unsigned_long *)
      local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (unsigned_long *)0x0) {
    operator_delete(local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_418.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((unsigned_long *)
      local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (unsigned_long *)0x0) {
    operator_delete(local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_358);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3b8);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    const caffe::ScaleParameter& caffeLayerParams =  caffeLayer.scale_param();
    
    #pragma unused(caffeLayerWeights)
    
    /* CoreML Scale layer does not support all the functionality of Caffe Scale layer.
     Certain error modes can only be detected at compile time when we have input shapes available.
     Such errors cannot be detected at conversion time.
     */
    if (caffeLayer.bottom_size() == 2){
        /*
        WARNING: Caffe Scale layer is currently not fully supported in CoreML.
        Conversion will proceed but certain modes exercised in Caffe may lead to error during compilation/runtime.
        Please refer to the CoreML documentation to see what is supported.
         */
    }
    
    /*
     Caffe can have scale as either an additional input or as a learned parameter. If former, there will be 2 bottoms,
     otherwise 1.
     if bottom_size == 1 => add an CoreML "scale" layer
     if bottom_size == 2 => add an MLkit "multiply" layer. If bias term is true then add another CoreML "bias" layer as well.
     */
   
    if (! (caffeLayer.bottom_size() == 1 || caffeLayer.bottom_size() == 2)){
        CoreMLConverter::errorInCaffeProto("Must have 1 or 2 input(s)",caffeLayer.name(),caffeLayer.type());
    }
    if (caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 output",caffeLayer.name(),caffeLayer.type());
    }
    
    auto* nnWrite = layerParameters.nnWrite;
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    
    int nBottom = caffeLayer.bottom_size();
    bool biasTerm = caffeLayerParams.bias_term();
    
    int biasLocation = 0;
    if (biasTerm) {
        if (nBottom == 1){
            biasLocation = 1;
        }
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if ((nBottom == 1 && !biasTerm) || (nBottom == 2 && biasTerm)){
        if (caffeLayerWeights.blobs_size() != 1){
            CoreMLConverter::errorInCaffeProto("There must be 1 weight blob",caffeLayer.name(),caffeLayer.type());
        }
    }
    if (nBottom == 1 && biasTerm){
        if (caffeLayerWeights.blobs_size() != 2){
            CoreMLConverter::errorInCaffeProto("There must be 2 weight blobs",caffeLayer.name(),caffeLayer.type());
        }
    }
    if (caffeLayerParams.axis() == 0 || caffeLayerParams.axis() == -4 ||
        caffeLayerParams.axis() == 3 || caffeLayerParams.axis() == -1 ) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),caffeLayer.type(),
                                                             std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.axis() == 1 || caffeLayerParams.axis() == -3){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 2){
                CoreMLConverter::errorInCaffeProto("Scale of size 2D when axis = 1 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 1 || caffeLayerParams.axis() == -3){
        if (biasTerm){
            if (caffeLayerWeights.blobs(biasLocation).shape().dim_size() == 2){
                CoreMLConverter::errorInCaffeProto("Bias of size 2D when axis = 1 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 2 || caffeLayerParams.axis() == -2){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 1){
                CoreMLConverter::errorInCaffeProto("Scale of size 1D when axis = 2 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 2 || caffeLayerParams.axis() == -2){
        if (biasTerm){
            if (caffeLayerWeights.blobs(biasLocation).shape().dim_size() == 1){
                CoreMLConverter::errorInCaffeProto("Bias of size 1D when axis = 2 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    //***************************************************************
    
    /*
     Get params related to the bias
     */
    std::vector<int64_t> biasShape;
    int biasSize = 1;
    if (biasTerm) {

        int dimSize = caffeLayerWeights.blobs(biasLocation).shape().dim_size();
        
        if (dimSize == 0){
            biasSize = 1;
        } else if (dimSize == 1){
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(0));
            biasSize *= biasShape.back();
        } else if (dimSize == 2){
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(0));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(1));
            biasSize *= biasShape.back();
        } else if (dimSize == 3 || dimSize == 4){
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(dimSize-3));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(dimSize-2));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(dimSize-1));
            biasSize *= biasShape.back();
            if (dimSize == 4 && caffeLayerWeights.blobs(biasLocation).shape().dim(0) != 1) {
                CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                     "4D bias only supported when 1st dimension is 1");
            }
        } else {
            CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                 ">4D bias not supported");
        }
        if (caffeLayerWeights.blobs(biasLocation).data_size() != biasSize){
            CoreMLConverter::errorInCaffeProto("Bias blob data inconsistent with the blob dimensions",caffeLayer.name(),caffeLayer.type());
        }
    }
    
    /*
     Get params related to scale when it is a learned parameter
     */
    std::vector<int64_t> scaleShape;
    int scaleSize = 1;
    if (nBottom == 1) {
        
        int dimSize = caffeLayerWeights.blobs(0).shape().dim_size();
        
        if (dimSize == 0){
            scaleSize = 1;
        } else if (dimSize == 1){
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            scaleSize *= scaleShape.back();
        } else if (dimSize == 2){
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            scaleSize *= scaleShape.back();
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(1));
            scaleSize *= scaleShape.back();
        } else if (dimSize == 3 || dimSize == 4){
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-3));
            scaleSize *= scaleShape.back();
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-2));
            scaleSize *= scaleShape.back();
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-1));
            scaleSize *= scaleShape.back();
            if (dimSize == 4 && caffeLayerWeights.blobs(0).shape().dim(0) != 1) {
                CoreMLConverter::unsupportedCaffeParrameterWithOption("scale",caffeLayer.name(),caffeLayer.type(),
                                                                     "4D scale only supported when 1st dimension is 1");
            }
        } else {
            CoreMLConverter::unsupportedCaffeParrameterWithOption("scale",caffeLayer.name(),caffeLayer.type(),
                                                                 ">4D scale not supported");
        }
        if (caffeLayerWeights.blobs(0).data_size() != scaleSize){
            CoreMLConverter::errorInCaffeProto("Scale blob data size inconsistent with the  blob dimensions",caffeLayer.name(),caffeLayer.type());
        }
    }
    
    /*
     Add appropriate CoreML layer(s) now
     */
    
    if (nBottom == 1){
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        
        Specification::ScaleLayerParams* specLayerParams = specLayer->mutable_scale();
        for (const auto& dim: scaleShape){
            assert(dim >= 0);
            specLayerParams->add_shapescale(static_cast<uint64_t>(dim));
        }
        ::google::protobuf::RepeatedField<float>* scaleWrite = specLayerParams->mutable_scale()->mutable_floatvalue();
        scaleWrite->Resize(scaleSize, 0.0);
        scaleWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
        if (biasTerm) {
            specLayerParams->set_hasbias(true);
            for (const auto& dim: biasShape){
                assert(dim >= 0);
                specLayerParams->add_shapebias(static_cast<uint64_t>(dim));
            }
            ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
            biasWrite->Resize(biasSize, 0.0);
            biasWrite->CopyFrom(caffeLayerWeights.blobs(1).data());
        }
    } else if (biasTerm) {
        Specification::NeuralNetworkLayer* specLayerMul = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        bottom.push_back(caffeLayer.bottom(1));
        std::vector<std::string> topMulLayer;
        topMulLayer.push_back(caffeLayer.name() + "_Mul_output");
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_Mul",
                                             bottom, topMulLayer,
                                             nnWrite, mappingDataBlobNames);
        
        (void) specLayerMul->mutable_multiply();
        Specification::NeuralNetworkLayer* specLayerBias = nnWrite->Add();
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_Bias",
                                             topMulLayer, top,
                                             nnWrite, mappingDataBlobNames);
        
        Specification::BiasLayerParams* specLayerParamsBias = specLayerBias->mutable_bias();
        for (const auto& dim: biasShape){
            assert(dim >= 0);
            specLayerParamsBias->add_shape(static_cast<uint64_t>(dim));
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParamsBias->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize(biasSize, 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
    } else {
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        bottom.push_back(caffeLayer.bottom(1));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_Mul", 
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        (void) specLayer->mutable_multiply();
    }
}